

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::internal::FunctionMockerBase<test_result_(fmt::v5::basic_string_view<wchar_t>)>::
ClearDefaultActionsLocked
          (FunctionMockerBase<test_result_(fmt::v5::basic_string_view<wchar_t>)> *this)

{
  pointer ppvVar1;
  pointer ppvVar2;
  void *pvVar3;
  pointer ppvVar4;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  ppvVar1 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppvVar2 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  for (ppvVar4 = ppvVar1; ppvVar4 != ppvVar2; ppvVar4 = ppvVar4 + 1) {
    pvVar3 = *ppvVar4;
    if (pvVar3 != (void *)0x0) {
      linked_ptr<testing::ActionInterface<test_result_(fmt::v5::basic_string_view<wchar_t>)>_>::
      ~linked_ptr((linked_ptr<testing::ActionInterface<test_result_(fmt::v5::basic_string_view<wchar_t>)>_>
                   *)((long)pvVar3 + 0x40));
      *(undefined ***)((long)pvVar3 + 0x28) = &PTR__MatcherBase_001d8040;
      linked_ptr<const_testing::MatcherInterface<const_std::tr1::tuple<fmt::v5::basic_string_view<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>_>
      ::~linked_ptr((linked_ptr<const_testing::MatcherInterface<const_std::tr1::tuple<fmt::v5::basic_string_view<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>_>
                     *)((long)pvVar3 + 0x30));
      *(undefined ***)((long)pvVar3 + 0x10) = &PTR__MatcherBase_001d4088;
      linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_>::
      ~linked_ptr((linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<wchar_t>_>_>
                   *)((long)pvVar3 + 0x18));
    }
    operator_delete(pvVar3);
  }
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  if (ppvVar1 != (pointer)0x0) {
    operator_delete(ppvVar1);
    return;
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    // Deleting our default actions may trigger other mock objects to be
    // deleted, for example if an action contains a reference counted smart
    // pointer to that mock object, and that is the last reference. So if we
    // delete our actions within the context of the global mutex we may deadlock
    // when this method is called again. Instead, make a copy of the set of
    // actions to delete, clear our set within the mutex, and then delete the
    // actions outside of the mutex.
    UntypedOnCallSpecs specs_to_delete;
    untyped_on_call_specs_.swap(specs_to_delete);

    g_gmock_mutex.Unlock();
    for (UntypedOnCallSpecs::const_iterator it =
             specs_to_delete.begin();
         it != specs_to_delete.end(); ++it) {
      delete static_cast<const OnCallSpec<F>*>(*it);
    }

    // Lock the mutex again, since the caller expects it to be locked when we
    // return.
    g_gmock_mutex.Lock();
  }